

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_test.cpp
# Opt level: O2

void evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>>
               (ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
                *e,double ref_solution)

{
  uint __line;
  ostream *poVar1;
  char *__assertion;
  numeric_type nVar2;
  type tVar3;
  vector<double,_std::allocator<double>_> p;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_38;
  
  std::vector<double,_std::allocator<double>_>::vector(&p,3,(allocator_type *)&local_38);
  *p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       4.0;
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 6.0;
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[2]
       = 8.0;
  poVar1 = viennamath::operator<<((ostream *)&std::cout,e);
  std::operator<<(poVar1," at STL (");
  poVar1 = std::ostream::_M_insert<double>
                     (*p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>
                     (p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>
                     (p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[2]);
  poVar1 = std::operator<<(poVar1,")");
  std::operator<<(poVar1," = ");
  nVar2 = viennamath::
          ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>
          ::operator()((ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>
                        *)e,&p);
  poVar1 = std::ostream::_M_insert<double>(nVar2);
  std::operator<<(poVar1," = ");
  tVar3 = viennamath::
          eval<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>,std::vector<double,std::allocator<double>>>
                    (SUB82(ref_solution,0),&p);
  poVar1 = std::ostream::_M_insert<double>(tVar3);
  std::operator<<(poVar1," (reference solution: ");
  poVar1 = std::ostream::_M_insert<double>(ref_solution);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  tVar3 = viennamath::
          eval<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>,std::vector<double,std::allocator<double>>>
                    (SUB82(ref_solution,0),&p);
  if (tVar3 <= ref_solution) {
    tVar3 = viennamath::
            eval<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>,std::vector<double,std::allocator<double>>>
                      (SUB82(ref_solution,0),&p);
    if (ref_solution <= tVar3) {
      poVar1 = viennamath::operator<<((ostream *)&std::cout,e);
      poVar1 = std::operator<<(poVar1," at vector_3 (");
      local_38.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001497f8;
      local_38.t0_.s = 4.0;
      local_38.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001498b8;
      local_38.t1_.s = 6;
      poVar1 = viennamath::operator<<(poVar1,&local_38);
      poVar1 = std::operator<<(poVar1,")");
      std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<double>(12.0);
      std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<double>(12.0);
      std::operator<<(poVar1," (reference solution: ");
      poVar1 = std::ostream::_M_insert<double>(ref_solution);
      poVar1 = std::operator<<(poVar1,")");
      std::endl<char,std::char_traits<char>>(poVar1);
      if ((ref_solution == 12.0) && (!NAN(ref_solution))) {
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&p.super__Vector_base<double,_std::allocator<double>_>);
        return;
      }
      __assertion = 
      "viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution"
      ;
      __line = 0x4b;
      goto LAB_00126aaa;
    }
  }
  __assertion = "viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution";
  __line = 0x45;
LAB_00126aaa:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_test.cpp"
                ,__line,
                "void evaluations_test(const E &, double) [E = viennamath::ct_binary_expr<viennamath::ct_constant<8>, viennamath::op_plus<double>, viennamath::ct_variable<>>]"
               );
}

Assistant:

void evaluations_test(E const & e, double ref_solution)
{
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;

  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;

  std::cout << e << " at STL (" << p[0] << ", " << p[1] << ", " << p[2] << ")"
            << " = " << e(p)
            << " = " << viennamath::eval(e,p)
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution);

  std::cout << e << " at vector_3 (" << viennamath::make_vector(c4, c6, c8) << ")"
            << " = " << e(viennamath::make_vector(c4, c6, c8))
            << " = " << viennamath::eval(e, viennamath::make_vector(c4, c6, c8))
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution);
}